

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O2

bool __thiscall
cmFLTKWrapUICommand::InitialPass
          (cmFLTKWrapUICommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  pointer ppcVar1;
  pointer ppcVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  cmSourceFile *pcVar6;
  string *sourceName;
  size_t classNum;
  long lVar7;
  ulong uVar8;
  allocator local_1c9;
  string sourceListValue;
  string varName;
  cmSourceFile *sf;
  string outputDirectory;
  cmCustomCommandLine commandLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  value_type local_d0;
  string cdir;
  string no_main_dependency;
  string origname;
  string cxxres;
  
  uVar8 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar8 < 0x21) {
    std::__cxx11::string::string
              ((string *)&cdir,"called with incorrect number of arguments",
               (allocator *)&outputDirectory);
    cmCommand::SetError(&this->super_cmCommand,&cdir);
  }
  else {
    pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&cdir,pcVar4,(allocator *)&outputDirectory);
    this_00 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&outputDirectory,"FLTK_FLUID_EXECUTABLE",(allocator *)&sourceListValue);
    pcVar4 = cmMakefile::GetRequiredDefinition(this_00,&outputDirectory);
    std::__cxx11::string::~string((string *)&outputDirectory);
    std::__cxx11::string::_M_assign((string *)&this->Target);
    pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&outputDirectory,pcVar5,(allocator *)&sourceListValue);
    sourceListValue._M_dataplus._M_p = (pointer)0x0;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sourceListValue,&outputDirectory);
    cmMakefile::AddIncludeDirectories
              ((this->super_cmCommand).Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sourceListValue,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sourceListValue);
    sourceName = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
LAB_002dccd1:
    sourceName = sourceName + 1;
    if (sourceName !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar6 = cmMakefile::GetSource((this->super_cmCommand).Makefile,sourceName);
      if (pcVar6 != (cmSourceFile *)0x0) goto LAB_002dccf9;
      goto LAB_002dcd31;
    }
    ppcVar1 = (this->GeneratedSourcesClasses).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppcVar2 = (this->GeneratedSourcesClasses).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_allocated_capacity =
         sourceListValue.field_2._M_allocated_capacity & 0xffffffffffffff00;
    for (lVar7 = 0; (long)ppcVar1 - (long)ppcVar2 >> 3 != lVar7; lVar7 = lVar7 + 1) {
      if (lVar7 != 0) {
        std::__cxx11::string::append((char *)&sourceListValue);
      }
      cmSourceFile::GetFullPath
                ((this->GeneratedSourcesClasses).
                 super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7],(string *)0x0);
      std::__cxx11::string::append((string *)&sourceListValue);
    }
    std::__cxx11::string::string((string *)&varName,(string *)&this->Target);
    std::__cxx11::string::append((char *)&varName);
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&varName,sourceListValue._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&varName);
    std::__cxx11::string::~string((string *)&sourceListValue);
    std::__cxx11::string::~string((string *)&outputDirectory);
  }
  std::__cxx11::string::~string((string *)&cdir);
  return 0x20 < uVar8;
LAB_002dccf9:
  std::__cxx11::string::string((string *)&sourceListValue,"WRAP_EXCLUDE",(allocator *)&varName);
  bVar3 = cmSourceFile::GetPropertyAsBool(pcVar6,&sourceListValue);
  std::__cxx11::string::~string((string *)&sourceListValue);
  if (!bVar3) {
LAB_002dcd31:
    std::__cxx11::string::string((string *)&sourceListValue,(string *)&outputDirectory);
    std::__cxx11::string::append((char *)&sourceListValue);
    cmsys::SystemTools::GetFilenameWithoutExtension(&varName,sourceName);
    std::__cxx11::string::append((string *)&sourceListValue);
    std::__cxx11::string::~string((string *)&varName);
    std::__cxx11::string::string((string *)&varName,(string *)&sourceListValue);
    std::__cxx11::string::append((char *)&varName);
    std::operator+(&cxxres,&cdir,"/");
    std::operator+(&origname,&cxxres,sourceName);
    std::__cxx11::string::~string((string *)&cxxres);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,&origname);
    std::__cxx11::string::string((string *)&cxxres,pcVar4,(allocator *)&no_main_dependency);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,&cxxres
              );
    std::__cxx11::string::~string((string *)&cxxres);
    std::__cxx11::string::string((string *)&cxxres,(string *)&sourceListValue);
    std::__cxx11::string::append((char *)&cxxres);
    commandLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commandLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commandLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&no_main_dependency,pcVar4,(allocator *)&local_d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               &no_main_dependency);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::__cxx11::string::string((string *)&no_main_dependency,"-c",(allocator *)&local_d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               &no_main_dependency);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::__cxx11::string::string((string *)&no_main_dependency,"-h",(allocator *)&local_d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               &no_main_dependency);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commandLine,&varName);
    std::__cxx11::string::string((string *)&no_main_dependency,"-o",(allocator *)&local_d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               &no_main_dependency);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commandLine,&cxxres);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commandLine,&origname);
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
               ,(value_type *)&commandLine);
    std::__cxx11::string::string((string *)&no_main_dependency,"",(allocator *)&local_d0);
    cmMakefile::AddCustomCommandToOutput
              ((this->super_cmCommand).Makefile,&cxxres,&depends,&no_main_dependency,&commandLines,
               (char *)0x0,(char *)0x0,false,true,false);
    cmMakefile::AddCustomCommandToOutput
              ((this->super_cmCommand).Makefile,&varName,&depends,&no_main_dependency,&commandLines,
               (char *)0x0,(char *)0x0,false,true,false);
    pcVar6 = cmMakefile::GetSource((this->super_cmCommand).Makefile,&cxxres);
    sf = pcVar6;
    std::__cxx11::string::string((string *)&local_d0,varName._M_dataplus._M_p,&local_1c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar6->Depends,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    pcVar6 = sf;
    std::__cxx11::string::string((string *)&local_d0,origname._M_dataplus._M_p,&local_1c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar6->Depends,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
              (&this->GeneratedSourcesClasses,&sf);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commandLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    std::__cxx11::string::~string((string *)&cxxres);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
    std::__cxx11::string::~string((string *)&origname);
    std::__cxx11::string::~string((string *)&varName);
    std::__cxx11::string::~string((string *)&sourceListValue);
  }
  goto LAB_002dccd1;
}

Assistant:

bool cmFLTKWrapUICommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // what is the current source dir
  std::string cdir = this->Makefile->GetCurrentSourceDirectory();
  const char* fluid_exe =
    this->Makefile->GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // get parameter for the command
  this->Target = args[0];  // Target that will use the generated files

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = this->Makefile->GetCurrentBinaryDirectory();

  {
  // Some of the generated files are *.h so the directory "GUI"
  // where they are created have to be added to the include path
  std::vector<std::string> outputDirectories;
  outputDirectories.push_back(outputDirectory);
  this->Makefile->AddIncludeDirectories( outputDirectories );
  }

  for(std::vector<std::string>::const_iterator i = (args.begin() + 1);
      i != args.end(); i++)
    {
    cmSourceFile *curr = this->Makefile->GetSource(*i);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE"))
      {
      std::string outName = outputDirectory;
      outName += "/";
      outName += cmSystemTools::GetFilenameWithoutExtension(*i);
      std::string hname = outName;
      hname += ".h";
      std::string origname = cdir + "/" + *i;
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = outName;
      cxxres += ".cxx";

      cmCustomCommandLine commandLine;
      commandLine.push_back(fluid_exe);
      commandLine.push_back("-c"); // instructs Fluid to run in command line
      commandLine.push_back("-h"); // optionally rename .h files
      commandLine.push_back(hname);
      commandLine.push_back("-o"); // optionally rename .cxx files
      commandLine.push_back(cxxres);
      commandLine.push_back(origname);// name of the GUI fluid file
      cmCustomCommandLines commandLines;
      commandLines.push_back(commandLine);

      // Add command for generating the .h and .cxx files
      std::string no_main_dependency = "";
      const char* no_comment = 0;
      const char* no_working_dir = 0;
      this->Makefile->AddCustomCommandToOutput(cxxres,
                                           depends, no_main_dependency,
                                           commandLines, no_comment,
                                           no_working_dir);
      this->Makefile->AddCustomCommandToOutput(hname,
                                           depends, no_main_dependency,
                                           commandLines, no_comment,
                                           no_working_dir);

      cmSourceFile *sf = this->Makefile->GetSource(cxxres);
      sf->AddDepend(hname.c_str());
      sf->AddDepend(origname.c_str());
      this->GeneratedSourcesClasses.push_back(sf);
      }
    }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = this->GeneratedSourcesClasses.size();
  std::string sourceListValue;
  for(size_t classNum = 0; classNum < lastHeadersClass; classNum++)
    {
    if (classNum)
      {
      sourceListValue += ";";
      }
    sourceListValue += this->GeneratedSourcesClasses[classNum]->GetFullPath();
    }
  std::string varName = this->Target;
  varName += "_FLTK_UI_SRCS";
  this->Makefile->AddDefinition(varName, sourceListValue.c_str());

  return true;
}